

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_clone(mbedtls_md_context_t *dst,mbedtls_md_context_t *src)

{
  mbedtls_md_context_t *src_local;
  mbedtls_md_context_t *dst_local;
  
  if ((((dst == (mbedtls_md_context_t *)0x0) || (dst->md_info == (mbedtls_md_info_t *)0x0)) ||
      (src == (mbedtls_md_context_t *)0x0)) ||
     ((src->md_info == (mbedtls_md_info_t *)0x0 || (dst->md_info != src->md_info)))) {
    dst_local._4_4_ = -0x5100;
  }
  else {
    switch(src->md_info->type) {
    case MBEDTLS_MD_MD5:
      mbedtls_md5_clone((mbedtls_md5_context *)dst->md_ctx,(mbedtls_md5_context *)src->md_ctx);
      break;
    case MBEDTLS_MD_SHA1:
      mbedtls_sha1_clone((mbedtls_sha1_context *)dst->md_ctx,(mbedtls_sha1_context *)src->md_ctx);
      break;
    case MBEDTLS_MD_SHA224:
    case MBEDTLS_MD_SHA256:
      mbedtls_sha256_clone
                ((mbedtls_sha256_context *)dst->md_ctx,(mbedtls_sha256_context *)src->md_ctx);
      break;
    case MBEDTLS_MD_SHA384:
    case MBEDTLS_MD_SHA512:
      mbedtls_sha512_clone
                ((mbedtls_sha512_context *)dst->md_ctx,(mbedtls_sha512_context *)src->md_ctx);
      break;
    case MBEDTLS_MD_RIPEMD160:
      mbedtls_ripemd160_clone
                ((mbedtls_ripemd160_context *)dst->md_ctx,(mbedtls_ripemd160_context *)src->md_ctx);
      break;
    default:
      return -0x5100;
    }
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

int mbedtls_md_clone( mbedtls_md_context_t *dst,
                      const mbedtls_md_context_t *src )
{
    if( dst == NULL || dst->md_info == NULL ||
        src == NULL || src->md_info == NULL ||
        dst->md_info != src->md_info )
    {
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }

    switch( src->md_info->type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            mbedtls_md2_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            mbedtls_md4_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            mbedtls_md5_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            mbedtls_ripemd160_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            mbedtls_sha1_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
        case MBEDTLS_MD_SHA256:
            mbedtls_sha256_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
#endif
        case MBEDTLS_MD_SHA512:
            mbedtls_sha512_clone( dst->md_ctx, src->md_ctx );
            break;
#endif
        default:
            return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }

    return( 0 );
}